

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_security_factory.c
# Opt level: O2

int iothub_security_set_symmetric_key_info(char *registration_name,char *symmetric_key)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  char *temp_name;
  char *temp_key;
  
  if (registration_name == (char *)0x0 || symmetric_key == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_security_factory.c"
                ,"iothub_security_set_symmetric_key_info",0x78,1,
                "Invalid parameter specified reg_name: %p, symm_key: %p",registration_name,
                symmetric_key);
      return 0x79;
    }
    return 0x79;
  }
  iVar1 = mallocAndStrcpy_s(&temp_name,registration_name);
  if (iVar1 == 0) {
    iVar1 = mallocAndStrcpy_s(&temp_key,symmetric_key);
    if (iVar1 != 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_security_factory.c"
                  ,"iothub_security_set_symmetric_key_info",0x86,1,
                  "Failure allocating symmetric key");
      }
      free(temp_name);
      return 0x88;
    }
    free(g_symm_key);
    free(g_symm_key_reg_name);
    g_symm_key_reg_name = temp_name;
    g_symm_key = temp_key;
    pcVar4 = prov_dev_get_symmetric_key();
    if (((pcVar4 != (char *)0x0) &&
        (pcVar4 = prov_dev_get_symm_registration_name(), pcVar4 != (char *)0x0)) ||
       (iVar1 = prov_dev_set_symmetric_key_info(g_symm_key_reg_name,g_symm_key), iVar1 == 0)) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x9d;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x9d;
    }
    pcVar4 = "Failure syncing dps & IoThub key information";
    iVar3 = 0x9c;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x82;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x82;
    }
    pcVar4 = "Failure allocating registration name";
    iVar3 = 0x81;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_security_factory.c"
            ,"iothub_security_set_symmetric_key_info",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int iothub_security_set_symmetric_key_info(const char* registration_name, const char* symmetric_key)
{
    int result;
    if (registration_name == NULL || symmetric_key == NULL)
    {
        LogError("Invalid parameter specified reg_name: %p, symm_key: %p", registration_name, symmetric_key);
        result = MU_FAILURE;
    }
    else
    {
        char* temp_key;
        char* temp_name;
        if (mallocAndStrcpy_s(&temp_name, registration_name) != 0)
        {
            LogError("Failure allocating registration name");
            result = MU_FAILURE;
        }
        else if (mallocAndStrcpy_s(&temp_key, symmetric_key) != 0)
        {
            LogError("Failure allocating symmetric key");
            free(temp_name);
            result = MU_FAILURE;
        }
        else
        {
            if (g_symm_key != NULL)
            {
                free(g_symm_key);
            }
            if (g_symm_key_reg_name != NULL)
            {
                free(g_symm_key_reg_name);
            }
            g_symm_key_reg_name = temp_name;
            g_symm_key = temp_key;

            // Sync iothub with dps
            if (prov_dev_get_symmetric_key() == NULL || prov_dev_get_symm_registration_name() == NULL)
            {
                if (prov_dev_set_symmetric_key_info(g_symm_key_reg_name, g_symm_key) != 0)
                {
                    LogError("Failure syncing dps & IoThub key information");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }
            else
            {
                result = 0;
            }
        }
    }
    return result;
}